

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *this)

{
  _dep *p_Var1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  _dep *p_Var5;
  _dep *last_datain;
  _dep *h;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  h = (_dep *)malloc((long)(iVar4 * iVar3));
  last_datain = (_dep *)((long)&h->w + (long)((iVar3 + -1) * iVar4));
  p_Var5 = h;
  do {
    p_Var5->w = (Workitem *)0x0;
    p_Var1 = (_dep *)((long)&p_Var5->w + (long)iVar4);
    p_Var5->next = p_Var1;
    p_Var5 = p_Var1;
  } while (p_Var1 <= last_datain);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  std::
  vector<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
  ::push_back(&this->v_,&h);
  freeLinkedList(this,h,last_datain,true);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }